

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O0

LPCSTR NpyArray::ParseHeaderNPY
                 (string *header,shape_t *shape,size_t *wordSize,char *type,bool *fortranOrder)

{
  size_t *this;
  bool bVar1;
  int iVar2;
  long lVar3;
  const_reference pvVar4;
  char *pcVar5;
  undefined1 *puVar6;
  bool local_1a1;
  string local_168;
  string local_148 [8];
  string str_ws;
  undefined1 local_120 [3];
  bool littleEndian;
  string_type local_100;
  value_type_conflict1 local_e0;
  undefined1 local_d8 [8];
  string strShape;
  smatch sm;
  regex num_regex;
  size_t loc2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  long local_40;
  size_t loc1;
  bool *fortranOrder_local;
  char *type_local;
  size_t *wordSize_local;
  shape_t *shape_local;
  string *header_local;
  
  loc1 = (size_t)fortranOrder;
  fortranOrder_local = (bool *)type;
  type_local = (char *)wordSize;
  wordSize_local = (size_t *)shape;
  shape_local = (shape_t *)header;
  local_40 = std::__cxx11::string::find((char *)header,0x19138c);
  if (local_40 == -1) {
    header_local = (string *)anon_var_dwarf_4e;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)shape_local);
    bVar1 = std::operator==(&local_60,"True");
    *(bool *)loc1 = bVar1;
    std::__cxx11::string::~string((string *)&local_60);
    local_40 = std::__cxx11::string::find((char *)shape_local,0x19154b);
    lVar3 = std::__cxx11::string::find((char *)shape_local,0x191f25);
    if ((local_40 == -1) || (lVar3 == -1)) {
      header_local = (string *)anon_var_dwarf_9a;
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)wordSize_local);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&sm._M_begin,"[0-9][0-9]*",
                 0x10);
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)((long)&strShape.field_2 + 8));
      std::__cxx11::string::substr((ulong)local_d8,(ulong)shape_local);
      while( true ) {
        bVar1 = std::
                regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d8,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)((long)&strShape.field_2 + 8),
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&sm._M_begin,0);
        this = wordSize_local;
        if (!bVar1) break;
        pvVar4 = std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)((long)&strShape.field_2 + 8),0);
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str(&local_100,pvVar4);
        iVar2 = std::__cxx11::stoi(&local_100,(size_t *)0x0,10);
        local_e0 = (value_type_conflict1)iVar2;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
        pvVar4 = std::__cxx11::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::suffix((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)((long)&strShape.field_2 + 8));
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str((string_type *)local_120,pvVar4);
        std::__cxx11::string::operator=((string *)local_d8,(string *)local_120);
        std::__cxx11::string::~string((string *)local_120);
      }
      local_40 = std::__cxx11::string::find((char *)shape_local,0x191410);
      if (local_40 == -1) {
        header_local = (string *)anon_var_dwarf_dc;
        str_ws.field_2._12_4_ = 1;
        local_40 = -1;
      }
      else {
        local_40 = local_40 + 9;
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)shape_local);
        local_1a1 = true;
        if (*pcVar5 != '<') {
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)shape_local);
          local_1a1 = *pcVar5 == '|';
        }
        str_ws.field_2._M_local_buf[0xb] = local_1a1;
        puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)shape_local);
        *fortranOrder_local = (bool)*puVar6;
        std::__cxx11::string::substr((ulong)local_148,(ulong)shape_local);
        std::__cxx11::string::find((char *)local_148,0x191525);
        std::__cxx11::string::substr((ulong)&local_168,(ulong)local_148);
        iVar2 = std::__cxx11::stoi(&local_168,(size_t *)0x0,10);
        *(long *)type_local = (long)iVar2;
        std::__cxx11::string::~string((string *)&local_168);
        header_local = (string *)0x0;
        str_ws.field_2._12_4_ = 1;
        std::__cxx11::string::~string(local_148);
      }
      std::__cxx11::string::~string((string *)local_d8);
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)((long)&strShape.field_2 + 8));
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&sm._M_begin);
    }
  }
  return (LPCSTR)header_local;
}

Assistant:

LPCSTR NpyArray::ParseHeaderNPY(const std::string& header, shape_t& shape, size_t& wordSize, char& type, bool& fortranOrder)
{
	ASSERT(header[header.size() - 1] == '\n');

	// fortran order
	size_t loc1 = header.find("fortran_order");
	if (loc1 == std::string::npos)
		return "error: failed to find header keyword 'fortran_order'";
	fortranOrder = (header.substr(loc1+16, 4) == "True");

	// shape
	loc1 = header.find("(");
	size_t loc2 = header.find(")");
	if (loc1 == std::string::npos || loc2 == std::string::npos)
		return "error: failed to find header keyword '(' or ')'";

	shape.clear();
	std::regex num_regex("[0-9][0-9]*");
	std::smatch sm;
	std::string strShape = header.substr(loc1 + 1, loc2 - loc1 - 1);
	while (std::regex_search(strShape, sm, num_regex)) {
		shape.push_back(std::stoi(sm[0].str()));
		strShape = sm.suffix().str();
	}

	// endian, word size, data type
	// byte order code | stands for not applicable. 
	// not sure when this applies except for byte array
	loc1 = header.find("descr");
	if (loc1 == std::string::npos)
		return "error: failed to find header keyword 'descr'";
	loc1 += 9;
	const bool littleEndian = (header[loc1] == '<' || header[loc1] == '|');
	ASSERT(littleEndian);
	type = header[loc1+1];

	const std::string str_ws = header.substr(loc1+2);
	loc2 = str_ws.find("'");
	wordSize = std::stoi(str_ws.substr(0, loc2));
	return NULL;
}